

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::test_ParseUInt8::test_method(test_ParseUInt8 *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  string_view str_21;
  string_view str_22;
  string_view str_23;
  string_view str_24;
  string_view str_25;
  bool bVar1;
  long in_FS_OFFSET;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_ffffffffffffee48;
  undefined7 in_stack_ffffffffffffee50;
  undefined1 in_stack_ffffffffffffee57;
  assertion_result *in_stack_ffffffffffffee58;
  assertion_result *this_00;
  char *in_stack_ffffffffffffee60;
  char *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee68;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  lazy_ostream *in_stack_ffffffffffffee70;
  size_t in_stack_ffffffffffffee78;
  assertion_result *line_num;
  const_string *in_stack_ffffffffffffee80;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffee88;
  unit_test_log_t *this_02;
  test_ParseUInt8 *this_local;
  const_string local_e58 [2];
  lazy_ostream local_e38 [3];
  assertion_result local_e08;
  basic_string_view<char,_std::char_traits<char>_> local_df0;
  char local_de0 [16];
  const_string local_dd0 [2];
  lazy_ostream local_db0 [3];
  assertion_result local_d80;
  unit_test_log_t local_d68 [2];
  const_string local_d58;
  const_string local_d48 [2];
  lazy_ostream local_d28 [3];
  assertion_result local_cf8 [2];
  const_string local_cc0 [2];
  lazy_ostream local_ca0 [3];
  assertion_result local_c70 [2];
  const_string local_c38 [2];
  lazy_ostream local_c18 [3];
  assertion_result local_be8 [2];
  const_string local_bb0 [2];
  lazy_ostream local_b90 [2];
  assertion_result local_b70 [2];
  const_string local_b38 [2];
  lazy_ostream local_b18 [3];
  assertion_result local_ae8 [2];
  const_string local_ab0 [2];
  lazy_ostream local_a90 [3];
  assertion_result local_a60 [2];
  const_string local_a28 [2];
  lazy_ostream local_a08 [3];
  assertion_result local_9d8 [2];
  const_string local_9a0 [2];
  lazy_ostream local_980 [3];
  assertion_result local_950 [2];
  const_string local_918 [2];
  lazy_ostream local_8f8 [3];
  assertion_result local_8c8 [2];
  const_string local_890 [2];
  lazy_ostream local_870 [3];
  assertion_result local_840 [2];
  const_string local_808 [2];
  lazy_ostream local_7e8 [3];
  assertion_result local_7b8 [2];
  const_string local_780 [2];
  lazy_ostream local_760 [3];
  assertion_result local_730 [2];
  const_string local_6f8 [2];
  lazy_ostream local_6d8 [3];
  assertion_result local_6a8 [2];
  const_string local_670 [2];
  lazy_ostream local_650 [3];
  assertion_result local_620 [2];
  const_string local_5e8 [2];
  lazy_ostream local_5c8 [3];
  assertion_result local_598 [2];
  const_string local_560 [2];
  lazy_ostream local_540 [3];
  assertion_result local_510 [2];
  const_string local_4d8 [2];
  lazy_ostream local_4b8 [3];
  assertion_result local_488 [2];
  const_string local_450 [2];
  lazy_ostream local_430 [3];
  assertion_result local_400 [2];
  const_string local_3c8 [2];
  lazy_ostream local_3a8 [3];
  assertion_result local_378 [2];
  const_string local_340 [2];
  lazy_ostream local_320 [3];
  assertion_result local_2f0 [2];
  const_string local_2b8 [2];
  lazy_ostream local_298 [3];
  assertion_result local_268 [2];
  const_string local_230 [2];
  lazy_ostream local_210 [3];
  assertion_result local_1e0 [2];
  const_string local_1a8 [2];
  lazy_ostream local_188 [3];
  assertion_result local_158 [2];
  const_string local_120 [2];
  lazy_ostream local_100 [3];
  assertion_result local_d0 [2];
  const_string local_98 [2];
  lazy_ostream local_78 [3];
  assertion_result local_48 [2];
  uint8_t n;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str._M_str = (char *)in_stack_ffffffffffffee68;
    str._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_48,local_78,local_98,0x36d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_00._M_str = (char *)in_stack_ffffffffffffee68;
    str_00._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_00,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d0,local_100,local_120,0x36e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_01._M_str = (char *)in_stack_ffffffffffffee68;
    str_01._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_01,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_158,local_188,local_1a8,0x36f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_02._M_str = (char *)in_stack_ffffffffffffee68;
    str_02._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_02,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e0,local_210,local_230,0x370,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_03._M_str = (char *)in_stack_ffffffffffffee68;
    str_03._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_03,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_268,local_298,local_2b8,0x371,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_04._M_str = (char *)in_stack_ffffffffffffee68;
    str_04._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_04,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2f0,local_320,local_340,0x372,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_05._M_str = (char *)in_stack_ffffffffffffee68;
    str_05._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_05,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_378,local_3a8,local_3c8,0x373,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_06._M_str = (char *)in_stack_ffffffffffffee68;
    str_06._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_06,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_400,local_430,local_450,0x374,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_07._M_str = (char *)in_stack_ffffffffffffee68;
    str_07._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_07,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_488,local_4b8,local_4d8,0x376,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_08._M_str = (char *)in_stack_ffffffffffffee68;
    str_08._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_08,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_510,local_540,local_560,0x377,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_09._M_str = (char *)in_stack_ffffffffffffee68;
    str_09._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_09,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_598,local_5c8,local_5e8,0x378,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_10._M_str = (char *)in_stack_ffffffffffffee68;
    str_10._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_10,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_620,local_650,local_670,0x379,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_11._M_str = (char *)in_stack_ffffffffffffee68;
    str_11._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_11,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6a8,local_6d8,local_6f8,0x37a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_12._M_str = (char *)in_stack_ffffffffffffee68;
    str_12._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_12,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_730,local_760,local_780,0x37b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_13._M_str = (char *)in_stack_ffffffffffffee68;
    str_13._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_13,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7b8,local_7e8,local_808,0x37c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_14._M_str = (char *)in_stack_ffffffffffffee68;
    str_14._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_14,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_840,local_870,local_890,0x37d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_15._M_str = (char *)in_stack_ffffffffffffee68;
    str_15._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_15,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8c8,local_8f8,local_918,0x37e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_16._M_str = (char *)in_stack_ffffffffffffee68;
    str_16._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_16,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_950,local_980,local_9a0,0x37f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_17._M_str = (char *)in_stack_ffffffffffffee68;
    str_17._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_17,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9d8,local_a08,local_a28,0x380,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_18._M_str = (char *)in_stack_ffffffffffffee68;
    str_18._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_18,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a60,local_a90,local_ab0,0x381,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_19._M_str = (char *)in_stack_ffffffffffffee68;
    str_19._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_19,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ae8,local_b18,local_b38,0x382,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffee68);
    str_20._M_str = (char *)in_stack_ffffffffffffee68;
    str_20._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_20,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b70,local_b90,local_bb0,899,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_21._M_str = (char *)in_stack_ffffffffffffee68;
    str_21._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_21,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_be8,local_c18,local_c38,0x385,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_22._M_str = (char *)in_stack_ffffffffffffee68;
    str_22._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_22,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c70,local_ca0,local_cc0,0x386,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffee88,in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,
               (const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_23._M_str = (char *)in_stack_ffffffffffffee68;
    str_23._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_23,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cf8,local_d28,local_d48,0x387,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_d58;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    this_02 = local_d68;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,file,(size_t)line_num,(const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffee68,
               in_stack_ffffffffffffee60);
    str_24._M_str = (char *)in_stack_ffffffffffffee68;
    str_24._M_len = (size_t)in_stack_ffffffffffffee60;
    ParseUInt8(str_24,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffee58,(bool)in_stack_ffffffffffffee57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee58,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_d80,local_db0,local_dd0,0x388,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    __str = local_de0;
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)boost::unit_test::(anonymous_namespace)::unit_test_log,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    this_01 = &local_df0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,file,(size_t)line_num,(const_string *)in_stack_ffffffffffffee70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_01,__str);
    str_25._M_str = (char *)this_01;
    str_25._M_len = (size_t)__str;
    ParseUInt8(str_25,(uint8_t *)in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::assertion_result(this_00,(bool)in_stack_ffffffffffffee57);
    in_stack_ffffffffffffee70 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (basic_cstring<const_char> *)in_stack_ffffffffffffee48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (unsigned_long)in_stack_ffffffffffffee48);
    in_stack_ffffffffffffee48 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_e08,local_e38,local_e58,0x389,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffee48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffee48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ParseUInt8)
{
    uint8_t n;
    // Valid values
    BOOST_CHECK(ParseUInt8("255", nullptr));
    BOOST_CHECK(ParseUInt8("0", &n) && n == 0);
    BOOST_CHECK(ParseUInt8("255", &n) && n == 255);
    BOOST_CHECK(ParseUInt8("0255", &n) && n == 255); // no octal
    BOOST_CHECK(ParseUInt8("255", &n) && n == static_cast<uint8_t>(255));
    BOOST_CHECK(ParseUInt8("+255", &n) && n == 255);
    BOOST_CHECK(ParseUInt8("00000000000000000012", &n) && n == 12);
    BOOST_CHECK(ParseUInt8("00000000000000000000", &n) && n == 0);
    // Invalid values
    BOOST_CHECK(!ParseUInt8("-00000000000000000000", &n));
    BOOST_CHECK(!ParseUInt8("", &n));
    BOOST_CHECK(!ParseUInt8(" 1", &n)); // no padding inside
    BOOST_CHECK(!ParseUInt8(" -1", &n));
    BOOST_CHECK(!ParseUInt8("++1", &n));
    BOOST_CHECK(!ParseUInt8("+-1", &n));
    BOOST_CHECK(!ParseUInt8("-+1", &n));
    BOOST_CHECK(!ParseUInt8("--1", &n));
    BOOST_CHECK(!ParseUInt8("-1", &n));
    BOOST_CHECK(!ParseUInt8("1 ", &n));
    BOOST_CHECK(!ParseUInt8("1a", &n));
    BOOST_CHECK(!ParseUInt8("aap", &n));
    BOOST_CHECK(!ParseUInt8("0x1", &n)); // no hex
    BOOST_CHECK(!ParseUInt8(STRING_WITH_EMBEDDED_NULL_CHAR, &n));
    // Overflow and underflow
    BOOST_CHECK(!ParseUInt8("-255", &n));
    BOOST_CHECK(!ParseUInt8("256", &n));
    BOOST_CHECK(!ParseUInt8("-123", &n));
    BOOST_CHECK(!ParseUInt8("-123", nullptr));
    BOOST_CHECK(!ParseUInt8("256", nullptr));
}